

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::encode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,uint w,
                    uint h,LodePNGColorType colortype,uint bitdepth)

{
  uchar *this;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  const_iterator local_48;
  uint local_3c;
  size_t sStack_38;
  uint error;
  size_t buffersize;
  uchar *buffer;
  uint bitdepth_local;
  LodePNGColorType colortype_local;
  uint h_local;
  uint w_local;
  uchar *in_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  buffer._0_4_ = bitdepth;
  buffer._4_4_ = colortype;
  bitdepth_local = h;
  colortype_local = w;
  _h_local = in;
  in_local = (uchar *)out;
  local_3c = lodepng_encode_memory
                       ((uchar **)&buffersize,&stack0xffffffffffffffc8,in,w,h,colortype,bitdepth);
  this = in_local;
  if (buffersize != 0) {
    local_50._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_local);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_48,&local_50);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,local_48,
               (uchar *)buffersize,(uchar *)(buffersize + sStack_38));
    lodepng_free((void *)buffersize);
  }
  return local_3c;
}

Assistant:

unsigned encode(std::vector<unsigned char>& out, const unsigned char* in, unsigned w, unsigned h,
                LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer;
  size_t buffersize;
  unsigned error = lodepng_encode_memory(&buffer, &buffersize, in, w, h, colortype, bitdepth);
  if(buffer) {
    out.insert(out.end(), buffer, &buffer[buffersize]);
    lodepng_free(buffer);
  }
  return error;
}